

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_utilities.cpp
# Opt level: O1

void ShaderUtilities::attach_point_light(GLuint p_shader_id,PointLight *point_light)

{
  GLfloat GVar1;
  PFNGLUNIFORM1FPROC p_Var2;
  PFNGLUNIFORM1IPROC p_Var3;
  PFNGLUNIFORM3FVPROC p_Var4;
  GLint GVar5;
  undefined8 local_60;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"point_light.position","");
  p_Var4 = glad_glUniform3fv;
  GVar5 = (*glad_glGetUniformLocation)(p_shader_id,(GLchar *)local_50[0]);
  (*p_Var4)(GVar5,1,(GLfloat *)point_light);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"point_light.ambient","");
  p_Var4 = glad_glUniform3fv;
  if (LightingDbWindow::enable_point_light == '\x01') {
    local_58 = (point_light->m_phong).m_ambient.field_2;
    local_60._0_4_ = (point_light->m_phong).m_ambient.field_0;
    local_60._4_4_ = (point_light->m_phong).m_ambient.field_1;
  }
  else {
    local_60 = 0;
    local_58.z = 0.0;
  }
  GVar5 = (*glad_glGetUniformLocation)(p_shader_id,(GLchar *)local_50[0]);
  (*p_Var4)(GVar5,1,(GLfloat *)&local_60);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"point_light.diffuse","");
  p_Var4 = glad_glUniform3fv;
  if (LightingDbWindow::enable_point_light == '\x01') {
    local_58 = (point_light->m_phong).m_diffuse.field_2;
    local_60._0_4_ = (point_light->m_phong).m_diffuse.field_0;
    local_60._4_4_ = (point_light->m_phong).m_diffuse.field_1;
  }
  else {
    local_60 = 0;
    local_58.z = 0.0;
  }
  GVar5 = (*glad_glGetUniformLocation)(p_shader_id,(GLchar *)local_50[0]);
  (*p_Var4)(GVar5,1,(GLfloat *)&local_60);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"point_light.specular","");
  p_Var4 = glad_glUniform3fv;
  if (LightingDbWindow::enable_point_light == '\x01') {
    local_58 = (point_light->m_phong).m_specular.field_2;
    local_60._0_4_ = (point_light->m_phong).m_specular.field_0;
    local_60._4_4_ = (point_light->m_phong).m_specular.field_1;
  }
  else {
    local_60 = 0;
    local_58.z = 0.0;
  }
  GVar5 = (*glad_glGetUniformLocation)(p_shader_id,(GLchar *)local_50[0]);
  (*p_Var4)(GVar5,1,(GLfloat *)&local_60);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"point_light.attenuation_value","");
  p_Var2 = glad_glUniform1f;
  GVar1 = (point_light->m_intensity).m_attval;
  GVar5 = (*glad_glGetUniformLocation)(p_shader_id,(GLchar *)local_50[0]);
  (*p_Var2)(GVar5,GVar1);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"point_light.constant","");
  p_Var2 = glad_glUniform1f;
  GVar1 = (point_light->m_intensity).m_constant;
  GVar5 = (*glad_glGetUniformLocation)(p_shader_id,(GLchar *)local_50[0]);
  (*p_Var2)(GVar5,GVar1);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"point_light.linear","");
  p_Var2 = glad_glUniform1f;
  GVar1 = (point_light->m_intensity).m_linear;
  GVar5 = (*glad_glGetUniformLocation)(p_shader_id,(GLchar *)local_50[0]);
  (*p_Var2)(GVar5,GVar1);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"point_light.quadratic","");
  p_Var2 = glad_glUniform1f;
  GVar1 = (point_light->m_intensity).m_quadratic;
  GVar5 = (*glad_glGetUniformLocation)(p_shader_id,(GLchar *)local_50[0]);
  (*p_Var2)(GVar5,GVar1);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"depth_map","");
  p_Var3 = glad_glUniform1i;
  GVar5 = (*glad_glGetUniformLocation)(p_shader_id,(GLchar *)local_50[0]);
  (*p_Var3)(GVar5,4);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  (*glad_glActiveTexture)(0x84c4);
  (*glad_glBindTexture)(0x8513,(point_light->m_buffer).m_cube_map);
  return;
}

Assistant:

void ShaderUtilities::attach_point_light(
    const GLuint p_shader_id,
    const PointLight &point_light) noexcept
{
    setVec3(
        p_shader_id,
        "point_light.position",
        point_light.m_position);
    setVec3(
        p_shader_id,
        "point_light.ambient",
        LightingDbWindow::enable_point_light ? point_light.m_phong.m_ambient
                                             : glm::vec3(0.0f));
    setVec3(
        p_shader_id,
        "point_light.diffuse",
        LightingDbWindow::enable_point_light ? point_light.m_phong.m_diffuse
                                             : glm::vec3(0.0f));
    setVec3(
        p_shader_id,
        "point_light.specular",
        LightingDbWindow::enable_point_light ? point_light.m_phong.m_specular
                                             : glm::vec3(0.0f));
    setFloat(
        p_shader_id,
        "point_light.attenuation_value",
        point_light.m_intensity.m_attval);
    setFloat(
        p_shader_id,
        "point_light.constant",
        point_light.m_intensity.m_constant);
    setFloat(
        p_shader_id,
        "point_light.linear",
        point_light.m_intensity.m_linear);
    setFloat(
        p_shader_id,
        "point_light.quadratic",
        point_light.m_intensity.m_quadratic);
    ShaderUtilities::setInt(
        p_shader_id,
        "depth_map",
        4);
    glActiveTexture(GL_TEXTURE4);
    glBindTexture(GL_TEXTURE_CUBE_MAP, point_light.m_buffer.m_cube_map);
}